

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O0

void drot(int n,double *x,int incx,double *y,int incy,double c,double s)

{
  double dVar1;
  double dVar2;
  double stemp;
  int local_48;
  int iy;
  int ix;
  int i;
  double s_local;
  double c_local;
  int incy_local;
  double *y_local;
  int incx_local;
  double *x_local;
  int n_local;
  
  if (0 < n) {
    if ((incx == 1) && (incy == 1)) {
      for (iy = 0; iy < n; iy = iy + 1) {
        dVar1 = x[iy];
        dVar2 = y[iy];
        y[iy] = c * y[iy] + -(s * x[iy]);
        x[iy] = c * dVar1 + s * dVar2;
      }
    }
    else {
      if (incx < 0) {
        local_48 = (1 - n) * incx;
      }
      else {
        local_48 = 0;
      }
      if (incy < 0) {
        stemp._4_4_ = (1 - n) * incy;
      }
      else {
        stemp._4_4_ = 0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        dVar1 = x[local_48];
        dVar2 = y[stemp._4_4_];
        y[stemp._4_4_] = c * y[stemp._4_4_] + -(s * x[local_48]);
        x[local_48] = c * dVar1 + s * dVar2;
        local_48 = local_48 + incx;
        stemp._4_4_ = stemp._4_4_ + incy;
      }
    }
  }
  return;
}

Assistant:

void drot ( int n, double x[], int incx, double y[], int incy, double c,
  double s )

//****************************************************************************80
//
//  Purpose:
//
//    DROT applies a plane rotation.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, double X[*], one of the vectors to be rotated.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, double Y[*], one of the vectors to be rotated.
//
//    Input, int INCY, the increment between successive elements of Y.
//
//    Input, double C, S, parameters (presumably the cosine and
//    sine of some angle) that define a plane rotation.
//
{
  int i;
  int ix;
  int iy;
  double stemp;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      stemp = c * x[i] + s * y[i];
      y[i]  = c * y[i] - s * x[i];
      x[i]  = stemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      stemp = c * x[ix] + s * y[iy];
      y[iy] = c * y[iy] - s * x[ix];
      x[ix] = stemp;
      ix = ix + incx;
      iy = iy + incy;
    }

  }

  return;
}